

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_display.cpp
# Opt level: O2

size_t __thiscall cppurses::Text_display::display_height(Text_display *this)

{
  size_t sVar1;
  ulong uVar2;
  
  uVar2 = ((long)(this->display_state_).
                 super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->display_state_).
                 super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4) - this->top_line_;
  sVar1 = Widget::height(&this->super_Widget);
  if (sVar1 < uVar2) {
    sVar1 = Widget::height(&this->super_Widget);
    return sVar1;
  }
  return uVar2;
}

Assistant:

std::size_t Text_display::display_height() const {
    auto difference = 1 + this->last_line() - this->top_line();
    if (difference > this->height()) {
        difference = this->height();
    }
    return difference;
}